

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor.h
# Opt level: O1

void __thiscall
FastPForLib::PFor::__encodeArray(PFor *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  uint32_t b;
  uint32_t uVar1;
  uint uVar2;
  pointer puVar3;
  uint32_t *headerout;
  uint *puVar4;
  ulong uVar5;
  DATATYPE *i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> exceptions;
  uint *local_60;
  uint32_t *local_58;
  size_t *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  checkifdivisibleby(len,0x80);
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_48,len);
  local_60 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_50 = nvalue;
  b = determineBestBase(in,len);
  *out = (uint32_t)len;
  puVar4 = out + 2;
  out[1] = b;
  local_58 = out;
  if (0x7f < len) {
    uVar5 = len >> 7;
    do {
      uVar1 = compressblockPFOR(this,in,puVar4 + 1,b,&local_60);
      in = in + 0x80;
      *puVar4 = ((int)local_60 -
                 (int)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start & 0x7fffffcU) << 5 | uVar1 & 0x7f;
      puVar4 = (uint *)((long)puVar4 + ((ulong)((b & 0x1ffffff) << 4) | 4));
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  if ((long)local_60 -
      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar2 = 1;
    puVar3 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *puVar4 = *puVar3;
      puVar4 = puVar4 + 1;
      uVar5 = (ulong)uVar2;
      puVar3 = puVar3 + 1;
      uVar2 = uVar2 + 1;
    } while (uVar5 < (ulong)((long)local_60 -
                             (long)local_48.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  *local_50 = (long)puVar4 - (long)local_58 >> 2;
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void __encodeArray(const uint32_t *in, const size_t len, uint32_t *out,
                     size_t &nvalue) {
    checkifdivisibleby(len, BlockSize);
    const uint32_t *const initout(out);
    std::vector<DATATYPE> exceptions;
    exceptions.resize(len);
    DATATYPE *__restrict__ i = &exceptions[0];
    const uint32_t b = determineBestBase(in, len);
    *out++ = static_cast<uint32_t>(len);
    *out++ = b;
    for (size_t k = 0; k < len / BlockSize; ++k) {
      uint32_t *const headerout(out);
      ++out;
      uint32_t firstexcept = compressblockPFOR(in, out, b, i);
      out += (BlockSize * b) / 32;
      in += BlockSize;
      const uint32_t bitsforfirstexcept = blocksizeinbits;
      const uint32_t firstexceptmask = (1U << blocksizeinbits) - 1;
      const uint32_t exceptindex = static_cast<uint32_t>(i - &exceptions[0]);
      *headerout =
          (firstexcept & firstexceptmask) | (exceptindex << bitsforfirstexcept);
    }
    const size_t howmanyexcept = i - &exceptions[0];
    for (uint32_t t = 0; t < howmanyexcept; ++t)
      *out++ = exceptions[t];
    nvalue = out - initout;
  }